

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecodersController::TransformAttributesToOriginalFormat
          (SequentialAttributeDecodersController *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  DecoderOptions *pDVar4;
  pointer pSVar5;
  PointAttribute *this_00;
  PointAttribute *pPVar6;
  undefined4 extraout_var_00;
  SequentialAttributeDecoder *in_RDI;
  PointAttribute *portable_attribute;
  PointAttribute *attribute;
  int i;
  int32_t num_attributes;
  undefined1 in_stack_ffffffffffffff77;
  AttributeKey *att_key;
  undefined7 in_stack_ffffffffffffff88;
  char cVar7;
  allocator<char> *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa8;
  byte bVar8;
  allocator<char> in_stack_ffffffffffffffaf;
  PointAttribute *in_stack_ffffffffffffffb0;
  int local_18;
  
  iVar1 = (*in_RDI->_vptr_SequentialAttributeDecoder[6])();
  local_18 = 0;
  do {
    if (iVar1 <= local_18) {
      return true;
    }
    iVar2 = (*in_RDI->_vptr_SequentialAttributeDecoder[7])();
    pDVar4 = PointCloudDecoder::options((PointCloudDecoder *)CONCAT44(extraout_var,iVar2));
    if (pDVar4 == (DecoderOptions *)0x0) {
LAB_001de3e7:
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].portable_attribute_,(long)local_18);
      pSVar5 = std::
               unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
               ::operator->((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                             *)0x1de405);
      uVar3 = (*pSVar5->_vptr_SequentialAttributeDecoder[6])(pSVar5,&in_RDI[2].attribute_);
      if ((uVar3 & 1) == 0) {
        return false;
      }
    }
    else {
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].portable_attribute_,(long)local_18);
      pSVar5 = std::
               unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
               ::operator->((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                             *)0x1de253);
      this_00 = SequentialAttributeDecoder::attribute(pSVar5);
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].portable_attribute_,(long)local_18);
      std::
      unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
      ::operator->((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                    *)0x1de27e);
      pPVar6 = SequentialAttributeDecoder::GetPortableAttribute(in_RDI);
      bVar8 = 0;
      cVar7 = false;
      if (pPVar6 != (PointAttribute *)0x0) {
        iVar2 = (*in_RDI->_vptr_SequentialAttributeDecoder[7])();
        pDVar4 = PointCloudDecoder::options((PointCloudDecoder *)CONCAT44(extraout_var_00,iVar2));
        GeometryAttribute::attribute_type(&this_00->super_GeometryAttribute);
        att_key = (AttributeKey *)&stack0xffffffffffffffaf;
        std::allocator<char>::allocator();
        bVar8 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffffb0,
                   (char *)CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(1,in_stack_ffffffffffffffa8))
                   ,in_stack_ffffffffffffffa0);
        cVar7 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                          ((DracoOptions<draco::GeometryAttribute::Type> *)
                           CONCAT17(cVar7,in_stack_ffffffffffffff88),att_key,(string *)pDVar4,
                           (bool)in_stack_ffffffffffffff77);
        in_stack_ffffffffffffff77 = cVar7;
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      }
      if ((bVar8 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
      }
      if ((bool)cVar7 == false) goto LAB_001de3e7;
      std::
      vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>,_std::allocator<std::unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>_>_>
                    *)&in_RDI[1].portable_attribute_,(long)local_18);
      pSVar5 = std::
               unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
               ::operator->((unique_ptr<draco::SequentialAttributeDecoder,_std::default_delete<draco::SequentialAttributeDecoder>_>
                             *)0x1de383);
      SequentialAttributeDecoder::attribute(pSVar5);
      PointAttribute::CopyFrom
                (in_stack_ffffffffffffffb0,
                 (PointAttribute *)
                 CONCAT17(in_stack_ffffffffffffffaf,CONCAT16(bVar8,in_stack_ffffffffffffffa8)));
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool SequentialAttributeDecodersController::
    TransformAttributesToOriginalFormat() {
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    // Check whether the attribute transform should be skipped.
    if (GetDecoder()->options()) {
      const PointAttribute *const attribute =
          sequential_decoders_[i]->attribute();
      const PointAttribute *const portable_attribute =
          sequential_decoders_[i]->GetPortableAttribute();
      if (portable_attribute &&
          GetDecoder()->options()->GetAttributeBool(
              attribute->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        sequential_decoders_[i]->attribute()->CopyFrom(*portable_attribute);
        continue;
      }
    }
    if (!sequential_decoders_[i]->TransformAttributeToOriginalFormat(
            point_ids_)) {
      return false;
    }
  }
  return true;
}